

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentPlanner.cpp
# Opt level: O2

vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_> * __thiscall
multi_agent_planning::MultiAgentPlanner::solve_baseline
          (vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
           *__return_storage_ptr__,MultiAgentPlanner *this,
          vector<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
          *agents,vector<multi_agent_planning::Instance,_std::allocator<multi_agent_planning::Instance>_>
                  *instances)

{
  pointer pPVar1;
  pointer pIVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  Instance instance;
  string local_70;
  Plan plan;
  
  (__return_storage_ptr__->
  super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar4 = 2;
  lVar3 = 0;
  for (uVar5 = 0;
      pPVar1 = (agents->
               super__Vector_base<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(agents->
                            super__Vector_base<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 >> 6);
      uVar5 = uVar5 + 1) {
    pIVar2 = (instances->
             super__Vector_base<multi_agent_planning::Instance,_std::allocator<multi_agent_planning::Instance>_>
             )._M_impl.super__Vector_impl_data._M_start;
    instance.goal = *(Vertex *)((long)&pIVar2->start + lVar4 * 4);
    instance.start = *(Vertex *)((long)pIVar2 + lVar4 * 4 + -8);
    PlanningAgent::computeSingleAgentPlan
              (&plan,(PlanningAgent *)((long)&pPVar1->agent_id + lVar3),instance);
    std::vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>::push_back
              (__return_storage_ptr__,&plan);
    PlanningAgent::planToString_abi_cxx11_
              (&local_70,
               (PlanningAgent *)
               ((long)&((agents->
                        super__Vector_base<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
                        )._M_impl.super__Vector_impl_data._M_start)->agent_id + lVar3),&plan);
    std::operator<<((ostream *)&std::cout,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::
    _Vector_base<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
    ::~_Vector_base((_Vector_base<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
                     *)&plan);
    lVar3 = lVar3 + 0x40;
    lVar4 = lVar4 + 4;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Plan> MultiAgentPlanner::solve_baseline(vector<PlanningAgent>& agents, 
																	            const vector<Instance>& instances) {
	vector<Plan> plans;

	for (int i = 0; i < agents.size(); ++i) {
		Plan plan = agents[i].computeSingleAgentPlan(instances[i]);
		plans.push_back(plan);

		cout << agents[i].planToString(plan);
	}

	return plans;
}